

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O0

int Map_CutMergeTwo(Map_Cut_t *pCut1,Map_Cut_t *pCut2,Map_Node_t **ppNodes,int nNodesMax)

{
  Map_Node_t *pMVar1;
  int local_4c;
  int local_48;
  int fMismatch;
  int min;
  int k;
  int i;
  int nTotal;
  Map_Node_t *pNodeTemp;
  int nNodesMax_local;
  Map_Node_t **ppNodes_local;
  Map_Cut_t *pCut2_local;
  Map_Cut_t *pCut1_local;
  
  if (pCut1->nLeaves == nNodesMax) {
    if (pCut2->nLeaves == nNodesMax) {
      min = 0;
      while( true ) {
        if (nNodesMax <= min) {
          for (min = 0; min < nNodesMax; min = min + 1) {
            ppNodes[min] = pCut1->ppLeaves[min];
          }
          return nNodesMax;
        }
        if (pCut1->ppLeaves[min] != pCut2->ppLeaves[min]) break;
        min = min + 1;
      }
      return 0;
    }
    if ((int)pCut2->nLeaves == nNodesMax + -1) {
      local_4c = 0;
      min = 0;
      do {
        if (nNodesMax <= min) {
          for (min = 0; min < nNodesMax; min = min + 1) {
            ppNodes[min] = pCut1->ppLeaves[min];
          }
          return nNodesMax;
        }
        if (pCut1->ppLeaves[min] != pCut2->ppLeaves[min - local_4c]) {
          if (local_4c == 1) {
            return 0;
          }
          local_4c = 1;
        }
        min = min + 1;
      } while( true );
    }
  }
  else if (((int)pCut1->nLeaves == nNodesMax + -1) && (pCut2->nLeaves == nNodesMax)) {
    local_4c = 0;
    min = 0;
    do {
      if (nNodesMax <= min) {
        for (min = 0; min < nNodesMax; min = min + 1) {
          ppNodes[min] = pCut2->ppLeaves[min];
        }
        return nNodesMax;
      }
      if (pCut1->ppLeaves[min - local_4c] != pCut2->ppLeaves[min]) {
        if (local_4c == 1) {
          return 0;
        }
        local_4c = 1;
      }
      min = min + 1;
    } while( true );
  }
  k = (int)pCut1->nLeaves;
  min = 0;
  do {
    if (pCut2->nLeaves <= min) {
      for (fMismatch = 0; fMismatch < pCut1->nLeaves; fMismatch = fMismatch + 1) {
        ppNodes[fMismatch] = pCut1->ppLeaves[fMismatch];
      }
      for (min = 0; min < k + -1; min = min + 1) {
        local_48 = min;
        fMismatch = min;
        while (fMismatch = fMismatch + 1, fMismatch < k) {
          if (ppNodes[fMismatch]->Num < ppNodes[local_48]->Num) {
            local_48 = fMismatch;
          }
        }
        pMVar1 = ppNodes[min];
        ppNodes[min] = ppNodes[local_48];
        ppNodes[local_48] = pMVar1;
      }
      return k;
    }
    for (fMismatch = 0;
        (fMismatch < pCut1->nLeaves && (pCut2->ppLeaves[min] != pCut1->ppLeaves[fMismatch]));
        fMismatch = fMismatch + 1) {
    }
    if (pCut1->nLeaves <= fMismatch) {
      if (k == nNodesMax) {
        return 0;
      }
      ppNodes[k] = pCut2->ppLeaves[min];
      k = k + 1;
    }
    min = min + 1;
  } while( true );
}

Assistant:

int Map_CutMergeTwo( Map_Cut_t * pCut1, Map_Cut_t * pCut2, Map_Node_t * ppNodes[], int nNodesMax )
{
    Map_Node_t * pNodeTemp;
    int nTotal, i, k, min, fMismatch;

    // check the special case when at least of the cuts is the largest
    if ( pCut1->nLeaves == nNodesMax )
    {
        if ( pCut2->nLeaves == nNodesMax )
        {
            // return 0 if the cuts are different
            for ( i = 0; i < nNodesMax; i++ )
                if ( pCut1->ppLeaves[i] != pCut2->ppLeaves[i] )
                    return 0;
            // return nNodesMax if they are the same
            for ( i = 0; i < nNodesMax; i++ )
                ppNodes[i] = pCut1->ppLeaves[i];
            return nNodesMax;
        }
        else if ( pCut2->nLeaves == nNodesMax - 1 ) 
        {
            // return 0 if the cuts are different
            fMismatch = 0;
            for ( i = 0; i < nNodesMax; i++ )
                if ( pCut1->ppLeaves[i] != pCut2->ppLeaves[i - fMismatch] )
                {
                    if ( fMismatch == 1 )
                        return 0;
                    fMismatch = 1;
                }
            // return nNodesMax if they are the same
            for ( i = 0; i < nNodesMax; i++ )
                ppNodes[i] = pCut1->ppLeaves[i];
            return nNodesMax;
        }
    }
    else if ( pCut1->nLeaves == nNodesMax - 1 && pCut2->nLeaves == nNodesMax )
    {
        // return 0 if the cuts are different
        fMismatch = 0;
        for ( i = 0; i < nNodesMax; i++ )
            if ( pCut1->ppLeaves[i - fMismatch] != pCut2->ppLeaves[i] )
            {
                if ( fMismatch == 1 )
                    return 0;
                fMismatch = 1;
            }
        // return nNodesMax if they are the same
        for ( i = 0; i < nNodesMax; i++ )
            ppNodes[i] = pCut2->ppLeaves[i];
        return nNodesMax;
    }

    // count the number of unique entries in pCut2
    nTotal = pCut1->nLeaves;
    for ( i = 0; i < pCut2->nLeaves; i++ )
    {
        // try to find this entry among the leaves of pCut1
        for ( k = 0; k < pCut1->nLeaves; k++ )
            if ( pCut2->ppLeaves[i] == pCut1->ppLeaves[k] )
                break;
        if ( k < pCut1->nLeaves ) // found
            continue;
        // we found a new entry to add
        if ( nTotal == nNodesMax )
            return 0;
        ppNodes[nTotal++] = pCut2->ppLeaves[i];
    }
    // we know that the feasible cut exists

    // add the starting entries
    for ( k = 0; k < pCut1->nLeaves; k++ )
        ppNodes[k] = pCut1->ppLeaves[k];

    // selection-sort the entries
    for ( i = 0; i < nTotal - 1; i++ )
    {
        min = i;
        for ( k = i+1; k < nTotal; k++ )
//            if ( ppNodes[k] < ppNodes[min] ) // reported bug fix (non-determinism!)
            if ( ppNodes[k]->Num < ppNodes[min]->Num )
                min = k;
        pNodeTemp    = ppNodes[i];
        ppNodes[i]   = ppNodes[min];
        ppNodes[min] = pNodeTemp;
    }

    return nTotal;
}